

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined1 local_78 [8];
  string dest;
  string local_48;
  ulong local_28;
  size_type max_len;
  size_type max_total_len;
  cmInstallExportGenerator *pcStack_10;
  bool useMD5;
  cmInstallExportGenerator *this_local;
  
  pcStack_10 = this;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  std::__cxx11::string::operator=((string *)&this->TempDir,pcVar1);
  pcVar1 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)&this->TempDir,pcVar1);
  std::__cxx11::string::operator+=((string *)&this->TempDir,"/Export");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->TempDir,"/");
    max_total_len._7_1_ = 0;
    max_len = 1000;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 < 1000) {
      lVar3 = std::__cxx11::string::size();
      local_28 = 1000 - lVar3;
      uVar2 = std::__cxx11::string::size();
      if (local_28 < uVar2) {
        max_total_len._7_1_ = 1;
      }
    }
    else {
      max_total_len._7_1_ = 1;
    }
    if ((max_total_len._7_1_ & 1) == 0) {
      std::__cxx11::string::string
                ((string *)local_78,(string *)&(this->super_cmInstallGenerator).Destination);
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
      if (*pcVar1 == '/') {
        puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_78);
        *puVar4 = 0x5f;
      }
      cmsys::SystemTools::ReplaceString((string *)local_78,":","_");
      cmsys::SystemTools::ReplaceString((string *)local_78,"../","__/");
      cmsys::SystemTools::ReplaceString((string *)local_78," ","_");
      std::__cxx11::string::operator+=((string *)&this->TempDir,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_48,&(this->super_cmInstallGenerator).Destination);
      std::__cxx11::string::operator+=((string *)&this->TempDir,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->Makefile->GetCurrentBinaryDirectory();
  this->TempDir += cmake::GetCMakeFilesDirectory();
  this->TempDir += "/Export";
  if(this->Destination.empty())
    {
    return;
    }
  else
    {
    this->TempDir += "/";
    }

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  if(this->TempDir.size() < max_total_len)
    {
    // Keep the total path length below the limit.
    std::string::size_type max_len = max_total_len - this->TempDir.size();
    if(this->Destination.size() > max_len)
      {
      useMD5 = true;
      }
    }
  else
    {
    useMD5 = true;
    }
  if(useMD5)
    {
    // Replace the destination path with a hash to keep it short.
    this->TempDir +=
      cmSystemTools::ComputeStringMD5(this->Destination);
    }
  else
    {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if(dest[0] == '/')
      {
      dest[0] = '_';
      }
    // Avoid windows full paths by removing colons.
    cmSystemTools::ReplaceString(dest, ":", "_");
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    cmSystemTools::ReplaceString(dest, " ", "_");
    this->TempDir += dest;
    }
}